

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

int __thiscall
cs_impl::
cni_helper<int_(*)(const_cs_impl::path_cs_ext::path_info_&),_int_(*)(const_cs_impl::path_cs_ext::path_info_&)>
::_call<0>(cni_helper<int_(*)(const_cs_impl::path_cs_ext::path_info_&),_int_(*)(const_cs_impl::path_cs_ext::path_info_&)>
           *this,vector *args,sequence<0> *param_3)

{
  int *piVar1;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  path_info *in_RDI;
  var *in_stack_00000100;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,0);
  try_convert_and_check<const_cs_impl::path_cs_ext::path_info_&,_const_cs_impl::path_cs_ext::path_info_&,_cs_impl::path_cs_ext::path_info,_0UL>
  ::convert(in_stack_00000100);
  std::function<int_(const_cs_impl::path_cs_ext::path_info_&)>::operator()
            ((function<int_(const_cs_impl::path_cs_ext::path_info_&)> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
  piVar1 = type_convertor<int,_int>::convert<int>((int *)&stack0xffffffffffffffe4);
  return *piVar1;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}